

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLCMAC.cpp
# Opt level: O2

EVP_CIPHER * __thiscall OSSLCMACDES::getEVPCipher(OSSLCMACDES *this)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_CIPHER *pEVar3;
  undefined4 extraout_var_00;
  long lVar2;
  
  iVar1 = (*(((this->super_OSSLEVPCMacAlgorithm).super_MacAlgorithm.currentKey)->super_Serialisable)
            ._vptr_Serialisable[7])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 == 0xa8) {
    pEVar3 = EVP_des_ede3_cbc();
    return (EVP_CIPHER *)pEVar3;
  }
  if (lVar2 != 0x70) {
    if (lVar2 == 0x38) {
      softHSMLog(3,"getEVPCipher",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLCMAC.cpp"
                 ,0x29,"Only supporting 3DES");
    }
    else {
      iVar1 = (*(((this->super_OSSLEVPCMacAlgorithm).super_MacAlgorithm.currentKey)->
                super_Serialisable)._vptr_Serialisable[7])();
      softHSMLog(3,"getEVPCipher",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLCMAC.cpp"
                 ,0x33,"Invalid DES bit len %i",CONCAT44(extraout_var_00,iVar1));
    }
    return (EVP_CIPHER *)0x0;
  }
  pEVar3 = EVP_des_ede_cbc();
  return (EVP_CIPHER *)pEVar3;
}

Assistant:

const EVP_CIPHER* OSSLCMACDES::getEVPCipher() const
{
	switch(currentKey->getBitLen())
	{
		case 56:
			ERROR_MSG("Only supporting 3DES");
			return NULL;
		case 112:
			return EVP_des_ede_cbc();
		case 168:
			return EVP_des_ede3_cbc();
		default:
			break;
	};

	ERROR_MSG("Invalid DES bit len %i", currentKey->getBitLen());

	return NULL;
}